

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

normal3d * tinyusdz::vnormalize(normal3d *__return_storage_ptr__,normal3d *a,double eps)

{
  double dVar1;
  double local_38;
  double len;
  double eps_local;
  normal3d *a_local;
  
  dVar1 = vlength(a);
  local_38 = eps;
  if (eps < dVar1) {
    local_38 = dVar1;
  }
  dVar1 = value::normal3d::operator[](a,0);
  __return_storage_ptr__->x = dVar1 / local_38;
  dVar1 = value::normal3d::operator[](a,1);
  __return_storage_ptr__->y = dVar1 / local_38;
  dVar1 = value::normal3d::operator[](a,2);
  __return_storage_ptr__->z = dVar1 / local_38;
  return __return_storage_ptr__;
}

Assistant:

value::normal3d vnormalize(const value::normal3d &a, const double eps) {
  double len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::normal3d({a[0] / len, a[1] / len, a[2] / len});
}